

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_encryptor.cpp
# Opt level: O2

bool cppcms::sessions::impl::hmac_cipher::equal(void *a,void *b,size_t n)

{
  long lVar1;
  size_t i;
  size_t sVar2;
  
  lVar1 = 0;
  for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
    lVar1 = lVar1 + (ulong)(*(char *)((long)a + sVar2) != *(char *)((long)b + sVar2));
  }
  return lVar1 == 0;
}

Assistant:

bool hmac_cipher::equal(void const *a,void const *b,size_t n)
{
	char const *left = static_cast<char const *>(a);
	char const *right = static_cast<char const *>(b);
	size_t diff = 0;
	for(size_t i=0;i<n;i++) {
		if(left[i]!=right[i])
			diff++;
	}
	return diff==0;
}